

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O3

int gdTransformAffineBoundingBox(gdRectPtr src,double *affine,gdRectPtr bbox)

{
  gdPointFPtr dst;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  gdPointF point;
  gdPointF local_a8;
  double local_98;
  undefined8 local_90;
  double local_88;
  double dStack_80;
  undefined8 local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  gdPointF local_38;
  
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_90 = 0;
  uVar1 = src->width;
  uVar2 = src->height;
  local_98 = (double)(int)uVar1;
  local_88 = (double)(int)uVar1;
  dStack_80 = (double)(int)uVar2;
  local_78 = 0;
  local_70 = (double)(int)uVar2;
  lVar5 = 0;
  do {
    dst = (gdPointFPtr)((long)&local_a8.x + lVar5);
    local_38.x = dst->x;
    local_38.y = *(double *)((long)&local_a8.y + lVar5);
    iVar4 = gdAffineApplyToPointF(dst,&local_38,affine);
    if (iVar4 != 1) {
      return 0;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  lVar5 = 0x10;
  auVar7._8_8_ = local_a8.y;
  auVar7._0_8_ = local_a8.x;
  auVar8 = auVar7;
  do {
    auVar3 = *(undefined1 (*) [16])((long)&local_a8.x + lVar5);
    auVar8 = minpd(auVar3,auVar8);
    auVar7 = maxpd(auVar3,auVar7);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_48 = CONCAT44((int)auVar8._8_8_,(int)auVar8._0_8_);
  uStack_40 = 0;
  local_68 = auVar7._0_8_ - auVar8._0_8_;
  dStack_60 = auVar7._8_8_ - auVar8._8_8_;
  local_58 = ceil(local_68);
  dVar6 = ceil(dStack_60);
  bbox->x = (undefined4)local_48;
  bbox->y = local_48._4_4_;
  bbox->width = (int)local_58 + 1;
  bbox->height = (int)dVar6 + 1;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdTransformAffineBoundingBox(gdRectPtr src, const double affine[6], gdRectPtr bbox)
{
	gdPointF extent[4], min, max, point;
	int i;

	extent[0].x=0.0;
	extent[0].y=0.0;
	extent[1].x=(double) src->width;
	extent[1].y=0.0;
	extent[2].x=(double) src->width;
	extent[2].y=(double) src->height;
	extent[3].x=0.0;
	extent[3].y=(double) src->height;

	for (i=0; i < 4; i++) {
		point=extent[i];
		if (gdAffineApplyToPointF(&extent[i], &point, affine) != GD_TRUE) {
			return GD_FALSE;
		}
	}
	min=extent[0];
	max=extent[0];

	for (i=1; i < 4; i++) {
		if (min.x > extent[i].x)
			min.x=extent[i].x;
		if (min.y > extent[i].y)
			min.y=extent[i].y;
		if (max.x < extent[i].x)
			max.x=extent[i].x;
		if (max.y < extent[i].y)
			max.y=extent[i].y;
	}
	bbox->x = (int) min.x;
	bbox->y = (int) min.y;
	bbox->width  = (int) ceil((max.x - min.x)) + 1;
	bbox->height = (int) ceil(max.y - min.y) + 1;

	return GD_TRUE;
}